

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsort.scat.c
# Opt level: O0

void ga_sort_scat_int_(Integer *pn,int *v,Integer *i,Integer *j,Integer *base)

{
  undefined4 uVar1;
  long lVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined4 *in_RSI;
  ulong *in_RDI;
  long *in_R8;
  long ib_2;
  long ia_2;
  int dtmp_2;
  int ltmp_2;
  long ib_1;
  long ia_1;
  int dtmp_1;
  int ltmp_1;
  long ib;
  long ia;
  int dtmp;
  int ltmp;
  Integer *base0;
  Integer n;
  Integer *hi;
  Integer *q;
  Integer *p;
  unsigned_long g;
  unsigned_long gap;
  
  if (1 < (long)*in_RDI) {
    n = (long)*in_RDI >> 1;
    ib = (long)(in_R8 + n * 2 + -1);
    if ((*in_RDI & 1) != 0) {
      ib = ib + 8;
    }
    for (; n != 1; n = n + -1) {
      base0 = (Integer *)n;
      _dtmp = in_R8 + n + -1;
      while (ia = (long)(_dtmp + (long)base0), (ulong)ia <= (ulong)ib) {
        base0 = (Integer *)((long)base0 * 2);
        if ((ia != ib) && (*(long *)ia < *(long *)(ia + 8))) {
          ia = ia + 8;
          base0 = (Integer *)((long)base0 + 1);
        }
        if (*(long *)ia <= *_dtmp) break;
        lVar4 = (long)_dtmp - (long)in_R8 >> 3;
        lVar5 = ia - (long)in_R8 >> 3;
        lVar2 = *_dtmp;
        *_dtmp = *(long *)ia;
        *(long *)ia = (long)(int)lVar2;
        uVar1 = in_RSI[lVar4];
        in_RSI[lVar4] = in_RSI[lVar5];
        in_RSI[lVar5] = uVar1;
        uVar3 = in_RDX[lVar4];
        in_RDX[lVar4] = in_RDX[lVar5];
        in_RDX[lVar5] = (long)(int)uVar3;
        uVar3 = in_RCX[lVar4];
        in_RCX[lVar4] = in_RCX[lVar5];
        in_RCX[lVar5] = (long)(int)uVar3;
        _dtmp = (long *)ia;
      }
    }
    for (; (long *)ib != in_R8; ib = ib + -8) {
      base0 = (Integer *)0x1;
      _dtmp = in_R8;
      while (ia = (long)(_dtmp + (long)base0), (ulong)ia <= (ulong)ib) {
        base0 = (Integer *)((long)base0 * 2);
        if ((ia != ib) && (*(long *)ia < *(long *)(ia + 8))) {
          ia = ia + 8;
          base0 = (Integer *)((long)base0 + 1);
        }
        if (*(long *)ia <= *_dtmp) break;
        lVar4 = (long)_dtmp - (long)in_R8 >> 3;
        lVar5 = ia - (long)in_R8 >> 3;
        lVar2 = *_dtmp;
        *_dtmp = *(long *)ia;
        *(long *)ia = (long)(int)lVar2;
        uVar1 = in_RSI[lVar4];
        in_RSI[lVar4] = in_RSI[lVar5];
        in_RSI[lVar5] = uVar1;
        uVar3 = in_RDX[lVar4];
        in_RDX[lVar4] = in_RDX[lVar5];
        in_RDX[lVar5] = (long)(int)uVar3;
        uVar3 = in_RCX[lVar4];
        in_RCX[lVar4] = in_RCX[lVar5];
        in_RCX[lVar5] = (long)(int)uVar3;
        _dtmp = (long *)ia;
      }
      lVar4 = ib - (long)in_R8 >> 3;
      lVar2 = *in_R8;
      *in_R8 = *(long *)ib;
      *(long *)ib = (long)(int)lVar2;
      uVar1 = *in_RSI;
      *in_RSI = in_RSI[lVar4];
      in_RSI[lVar4] = uVar1;
      uVar3 = *in_RDX;
      *in_RDX = in_RDX[lVar4];
      in_RDX[lVar4] = (long)(int)uVar3;
      uVar3 = *in_RCX;
      *in_RCX = in_RCX[lVar4];
      in_RCX[lVar4] = (long)(int)uVar3;
    }
  }
  return;
}

Assistant:

static void ga_sort_scat_int_(pn, v, i, j, base)
     Integer *pn;
     int *v;
     Integer *i;
     Integer *j;
     Integer *base;
{

  if (*pn < 2) return;

#  undef SWAP  
#  define SWAP(a,b) { \
    int ltmp; \
    int dtmp; \
    long ia = a - base; \
    long ib = b - base; \
    ltmp=*a; *a=*b; *b=ltmp; \
    dtmp=v[ia]; v[ia]=v[ib]; v[ib]=dtmp; \
    ltmp=i[ia]; i[ia]=i[ib]; i[ib]=ltmp; \
    ltmp=j[ia]; j[ia]=j[ib]; j[ib]=ltmp; \
  }
  INDEX_SORT(base,pn,SWAP);
}